

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O2

void __thiscall VM_Writer::write_arithmetic(VM_Writer *this,string *command)

{
  ostream *poVar1;
  string local_30;
  
  poVar1 = (ostream *)this->out_file;
  translate_operator(&local_30,this,command);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void VM_Writer::write_arithmetic(const std::string &command) {
    out_file << translate_operator(command) <<
    std::endl;
}